

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::pushVarCompAttrib
          (InstancedRenderingCase *this,
          vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
          *vec,float val)

{
  vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
  *this_00;
  value_type local_2c;
  value_type local_28;
  value_type local_24;
  undefined1 local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  bool isMatCase;
  bool isUintCase;
  bool isIntCase;
  bool isFloatCase;
  float val_local;
  vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
  *vec_local;
  InstancedRenderingCase *this_local;
  
  local_1c = val;
  _isMatCase = vec;
  vec_local = (vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
               *)this;
  local_1d = glu::isDataTypeFloatOrVec(this->m_rgbAttrType);
  local_1e = glu::isDataTypeIntOrIVec(this->m_rgbAttrType);
  local_1f = glu::isDataTypeUintOrUVec(this->m_rgbAttrType);
  local_20 = glu::isDataTypeMatrix(this->m_rgbAttrType);
  this_00 = _isMatCase;
  if (((local_1d & 1) != 0) || ((bool)local_20)) {
    vcns::VarComp::VarComp((VarComp *)&local_24,local_1c);
    std::
    vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
    ::push_back(this_00,&local_24);
  }
  else if ((local_1e & 1) == 0) {
    if ((local_1f & 1) != 0) {
      vcns::VarComp::VarComp((VarComp *)&local_2c,(deUint32)(long)(local_1c * 100.0 + 0.0));
      std::
      vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
      ::push_back(this_00,&local_2c);
    }
  }
  else {
    vcns::VarComp::VarComp((VarComp *)&local_28,(int)(local_1c * 100.0 + -50.0));
    std::
    vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
    ::push_back(this_00,&local_28);
  }
  return;
}

Assistant:

void InstancedRenderingCase::pushVarCompAttrib (vector<VarComp>& vec, float val)
{
	bool	isFloatCase	= glu::isDataTypeFloatOrVec(m_rgbAttrType);
	bool	isIntCase	= glu::isDataTypeIntOrIVec(m_rgbAttrType);
	bool	isUintCase	= glu::isDataTypeUintOrUVec(m_rgbAttrType);
	bool	isMatCase	= glu::isDataTypeMatrix(m_rgbAttrType);

	if (isFloatCase || isMatCase)
		vec.push_back(VarComp(val));
	else if (isIntCase)
		vec.push_back(VarComp((deInt32)(val*FLOAT_INT_SCALE + FLOAT_INT_BIAS)));
	else if (isUintCase)
		vec.push_back(VarComp((deUint32)(val*FLOAT_UINT_SCALE + FLOAT_UINT_BIAS)));
	else
		DE_ASSERT(DE_FALSE);
}